

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O3

int rhash_update(rhash ctx,void *message,size_t length)

{
  uint uVar1;
  code *pcVar2;
  rhash prVar3;
  ulong uVar4;
  
  uVar1 = (uint)ctx[1].msg_size;
  if (10 < uVar1) {
    __assert_fail("ectx->hash_vector_size <= RHASH_HASH_COUNT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibrhash/librhash/rhash.c"
                  ,0xcb,"int rhash_update(rhash, const void *, size_t)");
  }
  if ((ctx[1].hash_id == 0xb01dbabe) && (ctx->msg_size = ctx->msg_size + length, uVar1 != 0)) {
    prVar3 = ctx + 4;
    uVar4 = 0;
    do {
      pcVar2 = *(code **)(*(long *)&prVar3[-1].hash_id + 0x20);
      if (pcVar2 == (code *)0x0) {
        __assert_fail("info->update != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibrhash/librhash/rhash.c"
                      ,0xd3,"int rhash_update(rhash, const void *, size_t)");
      }
      (*pcVar2)(prVar3->msg_size,message,length);
      uVar4 = uVar4 + 1;
      prVar3 = prVar3 + 1;
    } while (uVar4 < (uint)ctx[1].msg_size);
  }
  return 0;
}

Assistant:

RHASH_API int rhash_update(rhash ctx, const void* message, size_t length)
{
	rhash_context_ext* const ectx = (rhash_context_ext*)ctx;
	unsigned i;

	assert(ectx->hash_vector_size <= RHASH_HASH_COUNT);
	if (ectx->state != STATE_ACTIVE) return 0; /* do nothing if canceled */

	ctx->msg_size += length;

	/* call update method for every algorithm */
	for (i = 0; i < ectx->hash_vector_size; i++) {
		struct rhash_hash_info* info = ectx->vector[i].hash_info;
		assert(info->update != 0);
		info->update(ectx->vector[i].context, message, length);
	}
	return 0; /* no error processing at the moment */
}